

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkResult vmaFindMemoryTypeIndexForBufferInfo
                   (VmaAllocator allocator,VkBufferCreateInfo *pBufferCreateInfo,
                   VmaAllocationCreateInfo *pAllocationCreateInfo,uint32_t *pMemoryTypeIndex)

{
  PFN_vkCreateBuffer p_Var1;
  PFN_vkDestroyBuffer p_Var2;
  VkDevice pVVar3;
  VkAllocationCallbacks *pVVar4;
  VkBufferCreateInfo *in_RSI;
  VmaAllocator_T *in_RDI;
  VkMemoryRequirements memReq_1;
  VkBuffer hBuffer;
  VkMemoryRequirements2 memReq;
  VkDeviceBufferMemoryRequirements devBufMemReq;
  VkResult res;
  VmaVulkanFunctions *funcs;
  VkDevice hDev;
  uint32_t *in_stack_ffffffffffffff68;
  VkFlags in_stack_ffffffffffffff74;
  VmaAllocationCreateInfo *in_stack_ffffffffffffff78;
  VkBuffer in_stack_ffffffffffffff80;
  uint32_t memoryTypeBits;
  VkBuffer pVVar5;
  VkStructureType in_stack_ffffffffffffff88;
  VkStructureType VVar6;
  undefined4 in_stack_ffffffffffffff8c;
  VkDeviceBufferMemoryRequirements local_50;
  VkResult local_34;
  VmaVulkanFunctions *local_30;
  VkDevice local_28;
  VkBufferCreateInfo *local_10;
  VmaAllocator_T *local_8;
  
  memoryTypeBits = (uint32_t)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  local_28 = in_RDI->m_hDevice;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_30 = VmaAllocator_T::GetVulkanFunctions(in_RDI);
  pVVar3 = local_28;
  if (local_30->vkGetDeviceBufferMemoryRequirements == (PFN_vkGetDeviceBufferMemoryRequirements)0x0)
  {
    pVVar5 = (VkBuffer)0x0;
    p_Var1 = local_30->vkCreateBuffer;
    pVVar4 = VmaAllocator_T::GetAllocationCallbacks(local_8);
    local_34 = (*p_Var1)(pVVar3,local_10,pVVar4,(VkBuffer *)&stack0xffffffffffffff80);
    if (local_34 == VK_SUCCESS) {
      memset(&stack0xffffffffffffff68,0,0x18);
      (*local_30->vkGetBufferMemoryRequirements)
                (local_28,pVVar5,(VkMemoryRequirements *)&stack0xffffffffffffff68);
      local_34 = VmaAllocator_T::FindMemoryTypeIndex
                           ((VmaAllocator_T *)
                            CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                            (uint32_t)((ulong)pVVar5 >> 0x20),in_stack_ffffffffffffff78,
                            in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
      pVVar3 = local_28;
      p_Var2 = local_30->vkDestroyBuffer;
      pVVar4 = VmaAllocator_T::GetAllocationCallbacks(local_8);
      (*p_Var2)(pVVar3,pVVar5,pVVar4);
    }
  }
  else {
    local_50.sType = VK_STRUCTURE_TYPE_DEVICE_BUFFER_MEMORY_REQUIREMENTS;
    local_50._4_4_ = 0;
    local_50.pNext = (void *)0x0;
    local_50.pCreateInfo = local_10;
    memset(&stack0xffffffffffffff88,0,0x28);
    VVar6 = VK_STRUCTURE_TYPE_MEMORY_REQUIREMENTS_2;
    (*local_30->vkGetDeviceBufferMemoryRequirements)
              (local_28,&local_50,(VkMemoryRequirements2 *)&stack0xffffffffffffff88);
    local_34 = VmaAllocator_T::FindMemoryTypeIndex
                         ((VmaAllocator_T *)CONCAT44(in_stack_ffffffffffffff8c,VVar6),memoryTypeBits
                          ,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                          in_stack_ffffffffffffff68);
  }
  return local_34;
}

Assistant:

VMA_CALL_PRE VkResult VMA_CALL_POST vmaFindMemoryTypeIndexForBufferInfo(
    VmaAllocator allocator,
    const VkBufferCreateInfo* pBufferCreateInfo,
    const VmaAllocationCreateInfo* pAllocationCreateInfo,
    uint32_t* pMemoryTypeIndex)
{
    VMA_ASSERT(allocator != VK_NULL_HANDLE);
    VMA_ASSERT(pBufferCreateInfo != VMA_NULL);
    VMA_ASSERT(pAllocationCreateInfo != VMA_NULL);
    VMA_ASSERT(pMemoryTypeIndex != VMA_NULL);

    const VkDevice hDev = allocator->m_hDevice;
    const VmaVulkanFunctions* funcs = &allocator->GetVulkanFunctions();
    VkResult res;

#if VMA_VULKAN_VERSION >= 1003000
    if(funcs->vkGetDeviceBufferMemoryRequirements)
    {
        // Can query straight from VkBufferCreateInfo :)
        VkDeviceBufferMemoryRequirements devBufMemReq = {VK_STRUCTURE_TYPE_DEVICE_BUFFER_MEMORY_REQUIREMENTS};
        devBufMemReq.pCreateInfo = pBufferCreateInfo;

        VkMemoryRequirements2 memReq = {VK_STRUCTURE_TYPE_MEMORY_REQUIREMENTS_2};
        (*funcs->vkGetDeviceBufferMemoryRequirements)(hDev, &devBufMemReq, &memReq);

        res = allocator->FindMemoryTypeIndex(
            memReq.memoryRequirements.memoryTypeBits, pAllocationCreateInfo, pBufferCreateInfo->usage, pMemoryTypeIndex);
    }
    else
#endif // #if VMA_VULKAN_VERSION >= 1003000
    {
        // Must create a dummy buffer to query :(
        VkBuffer hBuffer = VK_NULL_HANDLE;
        res = funcs->vkCreateBuffer(
            hDev, pBufferCreateInfo, allocator->GetAllocationCallbacks(), &hBuffer);
        if(res == VK_SUCCESS)
        {
            VkMemoryRequirements memReq = {};
            funcs->vkGetBufferMemoryRequirements(hDev, hBuffer, &memReq);

            res = allocator->FindMemoryTypeIndex(
                memReq.memoryTypeBits, pAllocationCreateInfo, pBufferCreateInfo->usage, pMemoryTypeIndex);

            funcs->vkDestroyBuffer(
                hDev, hBuffer, allocator->GetAllocationCallbacks());
        }
    }
    return res;
}